

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__encode_uint8_srgb2_linearalpha_AR(void *outputp,int width_times_channels,float *encode)

{
  char *pcVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  char *pcVar6;
  float fVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  stbir_uint8 sVar25;
  float *pfVar26;
  char *pcVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  short sVar32;
  short sVar34;
  short sVar35;
  short sVar36;
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  short sVar42;
  short sVar43;
  short sVar44;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar45;
  short sVar46;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  
  auVar24 = _DAT_0049a850;
  auVar23 = _DAT_0049a840;
  auVar22 = _DAT_0049a830;
  auVar21 = _DAT_0049a820;
  auVar20 = _DAT_0049a810;
  pcVar6 = (char *)((long)outputp + (long)width_times_channels);
  if (width_times_channels < 0x10) {
    do {
      sVar25 = stbir__linear_to_srgb_uchar(*encode);
      *(stbir_uint8 *)((long)outputp + 1) = sVar25;
      fVar29 = encode[1] * 255.0 + 0.5;
      fVar28 = 0.0;
      if (0.0 <= fVar29) {
        fVar28 = fVar29;
      }
      fVar29 = 255.0;
      if (fVar28 <= 255.0) {
        fVar29 = fVar28;
      }
      *(char *)outputp = (char)(int)fVar29;
      outputp = (void *)((long)outputp + 2);
      encode = encode + 2;
    } while (outputp < pcVar6);
  }
  else {
    pfVar26 = encode + (long)width_times_channels + -0x10;
    fVar28 = (float)DAT_0049a850;
    fVar29 = DAT_0049a850._4_4_;
    fVar30 = DAT_0049a850._8_4_;
    fVar31 = DAT_0049a850._12_4_;
    do {
      pcVar1 = (char *)((long)outputp + 0x10);
      pcVar27 = pcVar6 + -0x10;
      if (pcVar1 == pcVar6) {
        pcVar27 = pcVar1;
      }
      pfVar2 = encode + 0x10;
      fVar7 = *encode;
      pfVar8 = encode + 1;
      pfVar9 = encode + 2;
      pfVar10 = encode + 3;
      pfVar3 = encode + 4;
      pfVar11 = encode + 5;
      pfVar12 = encode + 6;
      pfVar13 = encode + 7;
      pfVar4 = encode + 8;
      pfVar14 = encode + 9;
      pfVar15 = encode + 10;
      pfVar16 = encode + 0xb;
      pfVar5 = encode + 0xc;
      pfVar17 = encode + 0xd;
      pfVar18 = encode + 0xe;
      pfVar19 = encode + 0xf;
      encode = pfVar26;
      if (pcVar1 == pcVar6) {
        encode = pfVar2;
      }
      if (pcVar1 <= pcVar6 + -0x10) {
        encode = pfVar2;
        pcVar27 = pcVar1;
      }
      auVar41._4_4_ = *pfVar3;
      auVar41._0_4_ = fVar7;
      auVar41._12_4_ = *pfVar5;
      auVar41._8_4_ = *pfVar4;
      auVar33._4_4_ = *pfVar12;
      auVar33._0_4_ = *pfVar9;
      auVar33._12_4_ = *pfVar18;
      auVar33._8_4_ = *pfVar15;
      auVar37 = maxps(auVar41,auVar20);
      auVar37 = minps(auVar37,auVar21);
      auVar58._0_4_ = *pfVar8 * fVar28 + 0.5;
      auVar58._4_4_ = *pfVar11 * fVar29 + 0.5;
      auVar58._8_4_ = *pfVar14 * fVar30 + 0.5;
      auVar58._12_4_ = *pfVar17 * fVar31 + 0.5;
      auVar59 = maxps(auVar58,ZEXT816(0));
      auVar59 = minps(auVar59,auVar24);
      auVar40._0_4_ = (int)auVar59._0_4_;
      auVar40._4_4_ = (int)auVar59._4_4_;
      auVar40._8_4_ = (int)auVar59._8_4_;
      auVar40._12_4_ = (int)auVar59._12_4_;
      auVar33 = maxps(auVar33,auVar20);
      auVar33 = minps(auVar33,auVar21);
      auVar47._0_4_ = *pfVar10 * fVar28 + 0.5;
      auVar47._4_4_ = *pfVar13 * fVar29 + 0.5;
      auVar47._8_4_ = *pfVar16 * fVar30 + 0.5;
      auVar47._12_4_ = *pfVar19 * fVar31 + 0.5;
      auVar59 = maxps(auVar47,ZEXT816(0));
      auVar59 = minps(auVar59,auVar24);
      auVar48._0_4_ = (int)auVar59._0_4_;
      auVar48._4_4_ = (int)auVar59._4_4_;
      auVar48._8_4_ = (int)auVar59._8_4_;
      auVar48._12_4_ = (int)auVar59._12_4_;
      auVar57._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar37._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar57._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar37._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar57._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar37._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar57._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar37._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar56._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar33._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar56._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar33._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar56._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar33._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar56._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar33._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar38._0_4_ = auVar37._0_4_ >> 0xc;
      auVar38._4_4_ = auVar37._4_4_ >> 0xc;
      auVar38._8_4_ = auVar37._8_4_ >> 0xc;
      auVar38._12_4_ = auVar37._12_4_ >> 0xc;
      auVar37 = pmaddwd(auVar38 & auVar22 | auVar23,auVar57);
      auVar39._0_4_ = auVar37._0_4_ >> 0x10;
      auVar39._4_4_ = auVar37._4_4_ >> 0x10;
      auVar39._8_4_ = auVar37._8_4_ >> 0x10;
      auVar39._12_4_ = auVar37._12_4_ >> 0x10;
      auVar41 = packssdw(auVar40,auVar39);
      auVar37._0_4_ = auVar33._0_4_ >> 0xc;
      auVar37._4_4_ = auVar33._4_4_ >> 0xc;
      auVar37._8_4_ = auVar33._8_4_ >> 0xc;
      auVar37._12_4_ = auVar33._12_4_ >> 0xc;
      auVar33 = pmaddwd(auVar37 & auVar22 | auVar23,auVar56);
      auVar59._0_4_ = auVar33._0_4_ >> 0x10;
      auVar59._4_4_ = auVar33._4_4_ >> 0x10;
      auVar59._8_4_ = auVar33._8_4_ >> 0x10;
      auVar59._12_4_ = auVar33._12_4_ >> 0x10;
      auVar33 = packssdw(auVar48,auVar59);
      sVar51 = auVar33._6_2_;
      sVar36 = auVar41._6_2_;
      sVar50 = auVar33._4_2_;
      sVar35 = auVar41._4_2_;
      sVar49 = auVar33._2_2_;
      sVar34 = auVar41._2_2_;
      sVar32 = auVar41._0_2_;
      sVar46 = auVar33._0_2_;
      sVar42 = auVar41._8_2_;
      sVar52 = auVar33._8_2_;
      sVar43 = auVar41._10_2_;
      sVar53 = auVar33._10_2_;
      sVar44 = auVar41._12_2_;
      sVar54 = auVar33._12_2_;
      sVar45 = auVar41._14_2_;
      sVar55 = auVar33._14_2_;
      *(char *)outputp = (0 < sVar32) * (sVar32 < 0x100) * auVar41[0] - (0xff < sVar32);
      *(char *)((long)outputp + 1) = (0 < sVar42) * (sVar42 < 0x100) * auVar41[8] - (0xff < sVar42);
      *(char *)((long)outputp + 2) = (0 < sVar46) * (sVar46 < 0x100) * auVar33[0] - (0xff < sVar46);
      *(char *)((long)outputp + 3) = (0 < sVar52) * (sVar52 < 0x100) * auVar33[8] - (0xff < sVar52);
      *(char *)((long)outputp + 4) = (0 < sVar34) * (sVar34 < 0x100) * auVar41[2] - (0xff < sVar34);
      *(char *)((long)outputp + 5) = (0 < sVar43) * (sVar43 < 0x100) * auVar41[10] - (0xff < sVar43)
      ;
      *(char *)((long)outputp + 6) = (0 < sVar49) * (sVar49 < 0x100) * auVar33[2] - (0xff < sVar49);
      *(char *)((long)outputp + 7) = (0 < sVar53) * (sVar53 < 0x100) * auVar33[10] - (0xff < sVar53)
      ;
      *(char *)((long)outputp + 8) = (0 < sVar35) * (sVar35 < 0x100) * auVar41[4] - (0xff < sVar35);
      *(char *)((long)outputp + 9) =
           (0 < sVar44) * (sVar44 < 0x100) * auVar41[0xc] - (0xff < sVar44);
      *(char *)((long)outputp + 10) = (0 < sVar50) * (sVar50 < 0x100) * auVar33[4] - (0xff < sVar50)
      ;
      *(char *)((long)outputp + 0xb) =
           (0 < sVar54) * (sVar54 < 0x100) * auVar33[0xc] - (0xff < sVar54);
      *(char *)((long)outputp + 0xc) =
           (0 < sVar36) * (sVar36 < 0x100) * auVar41[6] - (0xff < sVar36);
      *(char *)((long)outputp + 0xd) =
           (0 < sVar45) * (sVar45 < 0x100) * auVar41[0xe] - (0xff < sVar45);
      *(char *)((long)outputp + 0xe) =
           (0 < sVar51) * (sVar51 < 0x100) * auVar33[6] - (0xff < sVar51);
      *(char *)((long)outputp + 0xf) =
           (0 < sVar55) * (sVar55 < 0x100) * auVar33[0xe] - (0xff < sVar55);
      outputp = pcVar27;
    } while (pcVar1 != pcVar6);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_srgb2_linearalpha )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char*) outputp;
  unsigned char * end_output = ( (unsigned char*) output ) + width_times_channels;

  #ifdef STBIR_SIMD

  if ( width_times_channels >= 16 )
  {
    float const * end_encode_m16 = encode + width_times_channels - 16;
    end_output -= 16;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdf f0, f1, f2, f3;
      stbir__simdi i0, i1, i2, i3;

      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdf_load4_transposed( f0, f1, f2, f3, encode );

      stbir__min_max_shift20( i0, f0 );
      stbir__scale_and_convert( i1, f1 );
      stbir__min_max_shift20( i2, f2 );
      stbir__scale_and_convert( i3, f3 );

      stbir__simdi_table_lookup2( i0, i2, ( fp32_to_srgb8_tab4 - (127-13)*8 ) );

      stbir__linear_to_srgb_finish( i0, f0 );
      stbir__linear_to_srgb_finish( i2, f2 );

      stbir__interleave_pack_and_store_16_u8( output,  STBIR_strs_join1(i, ,stbir__encode_order0), STBIR_strs_join1(i, ,stbir__encode_order1), STBIR_strs_join1(i, ,stbir__encode_order2), STBIR_strs_join1(i, ,stbir__encode_order3) );

      output += 16;
      encode += 16;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 16 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m16;
    }
    return;
  }
  #endif

  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float f;
    STBIR_SIMD_NO_UNROLL(encode);

    output[stbir__decode_order0] = stbir__linear_to_srgb_uchar( encode[0] );

    f = encode[1] * stbir__max_uint8_as_float + 0.5f;
    STBIR_CLAMP(f, 0, 255);
    output[stbir__decode_order1] = (unsigned char) f;

    output += 2;
    encode += 2;
  } while( output < end_output );
}